

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked_definitions_section.cpp
# Opt level: O2

ostream * pstore::repo::operator<<(ostream *os,value_type *ld)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"{compilation:");
  poVar1 = pstore::operator<<(poVar1,&ld->compilation);
  poVar1 = std::operator<<(poVar1,", index:");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,", unused:");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,", pointer:");
  poVar1 = pstore::operator<<(poVar1,&ld->pointer);
  poVar1 = std::operator<<(poVar1,'}');
  return poVar1;
}

Assistant:

std::ostream & operator<< (std::ostream & os, linked_definitions::value_type const & ld) {
            return os << "{compilation:" << ld.compilation << ", index:" << ld.index
                      << ", unused:" << ld.unused << ", pointer:" << ld.pointer << '}';
        }